

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_DEFI(Context *ctx)

{
  uint uVar1;
  size_t in_RDX;
  char dst [64];
  char local_58 [72];
  
  get_ARB1_destarg_varname(ctx,local_58,in_RDX);
  push_output(ctx,&ctx->globals);
  output_line(ctx,"PARAM %s = { %d, %d, %d, %d };",local_58,(ulong)ctx->dwords[0],
              (ulong)ctx->dwords[1],(ulong)ctx->dwords[2],ctx->dwords[3]);
  if (0 < ctx->output_stack_len) {
    uVar1 = ctx->output_stack_len - 1;
    ctx->output_stack_len = uVar1;
    ctx->output = ctx->output_stack[uVar1];
    ctx->indent = ctx->indent_stack[uVar1];
    return;
  }
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_ARB1_DEFI(Context *ctx)
{
    char dst[64]; get_ARB1_destarg_varname(ctx, dst, sizeof (dst));
    const int32 *x = (const int32 *) ctx->dwords;
    push_output(ctx, &ctx->globals);
    output_line(ctx, "PARAM %s = { %d, %d, %d, %d };",
                dst, (int) x[0], (int) x[1], (int) x[2], (int) x[3]);
    pop_output(ctx);
}